

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

void stbds_strreset(stbds_string_arena *a)

{
  stbds_string_block *psVar1;
  stbds_string_block *__ptr;
  
  __ptr = a->storage;
  while (__ptr != (stbds_string_block *)0x0) {
    psVar1 = __ptr->next;
    free(__ptr);
    __ptr = psVar1;
  }
  a->storage = (stbds_string_block *)0x0;
  a->remaining = 0;
  a->block = '\0';
  a->mode = '\0';
  *(undefined6 *)&a->field_0x12 = 0;
  return;
}

Assistant:

void stbds_strreset(stbds_string_arena *a)
{
  stbds_string_block *x,*y;
  x = a->storage;
  while (x) {
    y = x->next;
    STBDS_FREE(NULL, x);
    x = y;
  }
  memset(a, 0, sizeof(*a));
}